

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void non_modal_cb(Fl_Light_Button *i,void *v)

{
  _func_int **pp_Var1;
  int iVar2;
  
  if ((char *)v != "LOAD") {
    current_widget[1].super_Fl_Type.field_0x45 = (i->super_Fl_Button).value_;
    set_modflag(1);
    return;
  }
  iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
  pp_Var1 = (i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget;
  if (iVar2 != 0) {
    (*pp_Var1[5])(i);
    Fl_Button::value(&i->super_Fl_Button,(uint)(byte)current_widget[1].super_Fl_Type.field_0x45);
    return;
  }
  (*pp_Var1[6])(i);
  return;
}

Assistant:

void non_modal_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->hide(); return;}
    i->show();
    i->value(((Fl_Window_Type *)current_widget)->non_modal);
  } else {
    ((Fl_Window_Type *)current_widget)->non_modal = i->value();
    set_modflag(1);
  }
}